

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_prop_arrays.h
# Opt level: O2

bool __thiscall
spvtools::opt::CopyPropagateArrays::MemoryObject::Contains(MemoryObject *this,MemoryObject *other)

{
  pointer pAVar1;
  pointer pAVar2;
  bool bVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  
  if (this->variable_inst_ != other->variable_inst_) {
    return false;
  }
  pAVar1 = (this->access_chain_).
           super__Vector_base<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = (long)(this->access_chain_).
                super__Vector_base<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar1;
  pAVar2 = (other->access_chain_).
           super__Vector_base<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar5 = 0;
  bVar3 = false;
  if (uVar4 <= (ulong)((long)(other->access_chain_).
                             super__Vector_base<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar2)) {
    uVar4 = (long)uVar4 >> 3;
    do {
      uVar6 = (ulong)uVar5;
      bVar3 = uVar4 <= uVar6;
      if (uVar4 <= uVar6) {
        return bVar3;
      }
      if (pAVar2[uVar6].is_result_id != pAVar1[uVar6].is_result_id) {
        return bVar3;
      }
      uVar5 = uVar5 + 1;
    } while (pAVar2[uVar6].field_1.result_id == pAVar1[uVar6].field_1.result_id);
  }
  return bVar3;
}

Assistant:

Instruction* GetVariable() const { return variable_inst_; }